

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planetephem.cpp
# Opt level: O2

void PrintEphemeris(CEObservation *obs,double *duration,double *step_size)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  CEDate *this;
  long lVar11;
  undefined8 uVar12;
  double dVar13;
  int iVar14;
  long lVar15;
  undefined8 local_1f8 [2];
  double local_1e8 [8];
  vector<double,_std::allocator<double>_> dec;
  vector<double,_std::allocator<double>_> ra;
  double local_128 [2];
  vector<double,_std::allocator<double>_> lat_dms;
  vector<double,_std::allocator<double>_> lon_dms;
  vector<double,_std::allocator<double>_> localtime;
  CESkyCoord appar_coords;
  double local_a0 [8];
  CESkyCoord obs_coords;
  
  this = *(CEDate **)(obs + 0x10);
  if (*(long *)(obs + 8) == 0) {
    lVar15 = 0;
  }
  else {
    lVar15 = __dynamic_cast(*(long *)(obs + 8),&CEBody::typeinfo,&CEPlanet::typeinfo,0);
  }
  lVar11 = *(long *)(obs + 0x18);
  local_a0[0] = *(double *)(lVar11 + 0xa8);
  local_1e8[0] = (double)(**(code **)(*(long *)this + 0x48))(this,local_a0);
  CETime::TimeDbl2Vect((double *)&localtime);
  local_a0[0] = *(double *)(lVar11 + 8);
  CEAngle::CEAngle((CEAngle *)local_1e8,local_a0);
  CEAngle::DmsVect();
  CEAngle::~CEAngle((CEAngle *)local_1e8);
  local_a0[0] = *(double *)(lVar11 + 0x10);
  CEAngle::CEAngle((CEAngle *)local_1e8,local_a0);
  CEAngle::DmsVect();
  CEAngle::~CEAngle((CEAngle *)local_1e8);
  putchar(10);
  puts("= OBSERVER ===================");
  printf("  Longitude: %+4dd %02dm %4.1fs\n",
         SUB84(lon_dms.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[2] +
               lon_dms.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[3],0),
         (ulong)(uint)(int)*lon_dms.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start,
         (ulong)(uint)(int)lon_dms.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[1]);
  printf("  Latitude :  %+3dd %02dm %4.1fs\n",
         SUB84(lat_dms.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[2] +
               lat_dms.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[3],0),
         (ulong)(uint)(int)*lat_dms.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start,
         (ulong)(uint)(int)lat_dms.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[1]);
  printf("  Elevation: %f m \n",(int)*(undefined8 *)(lVar11 + 0x18));
  printf("  Pressure : %f hPa\n",(int)*(undefined8 *)(lVar11 + 0x20));
  printf("  Temp     : %f Celsius\n",(int)*(undefined8 *)(lVar11 + 0x28));
  printf("  Humidity : %f %%\n",SUB84(*(double *)(lVar11 + 0x30) * 100.0,0));
  printf("  Wavelen. : %f micrometers\n",(int)*(undefined8 *)(lVar11 + 0x38));
  printf("  LocalTime: %02d:%02d:%04.1f\n",
         SUB84(localtime.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[2] +
               localtime.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[3],0),
         (ulong)(uint)(int)*localtime.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start,
         (ulong)(uint)(int)localtime.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[1]);
  printf("  UTCOffset: %2d hrs\n\n",(ulong)(uint)(int)*(double *)(lVar11 + 0xa8));
  puts("= PLANET =====================");
  std::__cxx11::string::string((string *)local_1e8,(string *)(lVar15 + 0x30));
  printf("  Name  : %s\n",local_1e8[0]);
  std::__cxx11::string::~string((string *)local_1e8);
  printf("  Mass  : %e kg\n",(int)*(undefined8 *)(lVar15 + 0x58));
  printf("  Radius: %f km\n",SUB84(*(double *)(lVar15 + 0x50) / 1000.0,0));
  printf("  Albedo: %f\n\n",(int)*(undefined8 *)(lVar15 + 0x60));
  ra.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  ra.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  ra.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  dec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  dec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  dec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  puts("= NOTES ======================");
  puts("  * RA,DEC represent apparent ICRS coordinates for the observer");
  puts("  * Coordinates should be considered dubious at small altitudes");
  putchar(10);
  puts("      JD        LOCAL     RA (appar.)    DEC (appar.)     Az       Alt  ");
  puts(" =======================================================================");
  dVar1 = *duration;
  dVar2 = *step_size;
  CESkyCoord::CESkyCoord(&obs_coords);
  CESkyCoord::CESkyCoord(&appar_coords);
  for (iVar14 = 0; iVar14 <= (int)(dVar1 / dVar2); iVar14 = iVar14 + 1) {
    local_1f8[0] = (**(code **)(*(long *)obs + 0x28))();
    CEAngle::CEAngle((CEAngle *)local_1e8,(double *)local_1f8);
    local_128[0] = (double)(**(code **)(*(long *)obs + 0x38))();
    CEAngle::CEAngle((CEAngle *)local_a0,local_128);
    CESkyCoord::SetCoordinates
              ((CEAngle *)&obs_coords,(CEAngle *)local_1e8,(CESkyCoordType *)local_a0);
    CEAngle::~CEAngle((CEAngle *)local_a0);
    CEAngle::~CEAngle((CEAngle *)local_1e8);
    CESkyCoord::ConvertToICRS((CEDate *)local_1e8,(CEObserver *)&obs_coords);
    CESkyCoord::operator=(&appar_coords,(CESkyCoord *)local_1e8);
    CESkyCoord::~CESkyCoord((CESkyCoord *)local_1e8);
    CEDate::CEDate((CEDate *)local_1e8,2451545.0,JD);
    CESkyCoord::XCoord((CESkyCoord *)local_1f8,(CEDate *)&appar_coords);
    CEAngle::HmsVect();
    std::vector<double,_std::allocator<double>_>::_M_move_assign(&ra);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)local_a0);
    CEAngle::~CEAngle((CEAngle *)local_1f8);
    CEDate::~CEDate((CEDate *)local_1e8);
    CEDate::CEDate((CEDate *)local_1e8,2451545.0,JD);
    CESkyCoord::YCoord((CESkyCoord *)local_1f8,(CEDate *)&appar_coords);
    CEAngle::DmsVect();
    std::vector<double,_std::allocator<double>_>::_M_move_assign(&dec,(CEAngle *)local_a0);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)local_a0);
    CEAngle::~CEAngle((CEAngle *)local_1f8);
    CEDate::~CEDate((CEDate *)local_1e8);
    dVar13 = CEDate::operator_cast_to_double(this);
    uVar12 = (**(code **)(*(long *)this + 0x48))(this);
    dVar3 = *ra.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    dVar4 = ra.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[1];
    dVar5 = ra.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[2];
    dVar6 = ra.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[3];
    dVar7 = *dec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
             ._M_start;
    dVar8 = dec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[1];
    dVar9 = dec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[2];
    dVar10 = dec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
             ._M_start[3];
    CEDate::CEDate((CEDate *)local_1e8,2451545.0,JD);
    CESkyCoord::XCoord((CESkyCoord *)local_1f8,(CEDate *)&obs_coords);
    CEAngle::Deg();
    CEDate::CEDate((CEDate *)local_a0,2451545.0,JD);
    CESkyCoord::YCoord((CESkyCoord *)local_128,(CEDate *)&obs_coords);
    CEAngle::Deg();
    printf(" %11.2f  %08.1f  %2.0fh %2.0fm %4.1fs  %+3.0fd %2.0fm %4.1fs  %8.3f  %+7.3f\n",
           SUB84(dVar13,0),uVar12,dVar3,dVar4,dVar5 + dVar6,dVar7,dVar8,dVar9 + dVar10);
    CEAngle::~CEAngle((CEAngle *)local_128);
    CEDate::~CEDate((CEDate *)local_a0);
    CEAngle::~CEAngle((CEAngle *)local_1f8);
    CEDate::~CEDate((CEDate *)local_1e8);
    local_1e8[0] = (double)(**(code **)(*(long *)this + 0x20))(this);
    local_1e8[0] = local_1e8[0] + *step_size / 1440.0;
    local_a0[0] = (double)((ulong)local_a0[0] & 0xffffffff00000000);
    (**(code **)(*(long *)this + 0x10))(this,(CEAngle *)local_1e8,(CEAngle *)local_a0);
  }
  puts(" -------------------------------------------------------------------");
  CESkyCoord::~CESkyCoord(&appar_coords);
  CESkyCoord::~CESkyCoord(&obs_coords);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&dec.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&ra.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&lat_dms.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&lon_dms.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&localtime.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void PrintEphemeris(CEObservation& obs, 
                    const double&  duration, 
                    const double&  step_size)
{
    // Lets get the objects in obs
    CEDate* date = obs.Date();
    CEPlanet* planet = dynamic_cast<CEPlanet*>( obs.Body() );
    CEObserver* observer = obs.Observer();
    std::vector<double> localtime = CETime::TimeDbl2Vect(date->GetTime(observer->UTCOffset()));
    
    // Print some information about the observer
    std::vector<double> lon_dms = CEAngle(observer->Longitude_Rad()).DmsVect();
    std::vector<double> lat_dms = CEAngle(observer->Latitude_Rad()).DmsVect();

    std::printf("\n") ;
    std::printf("= OBSERVER ===================\n");
    std::printf("  Longitude: %+4dd %02dm %4.1fs\n", int(lon_dms[0]), int(lon_dms[1]), lon_dms[2]+lon_dms[3]);
    std::printf("  Latitude :  %+3dd %02dm %4.1fs\n", int(lat_dms[0]), int(lat_dms[1]), lat_dms[2]+lat_dms[3]);
    std::printf("  Elevation: %f m \n", observer->Elevation_m());
    std::printf("  Pressure : %f hPa\n", observer->Pressure_hPa());
    std::printf("  Temp     : %f Celsius\n", observer->Temperature_C());
    std::printf("  Humidity : %f %%\n", 100.0*observer->RelativeHumidity());
    std::printf("  Wavelen. : %f micrometers\n", observer->Wavelength_um());
    std::printf("  LocalTime: %02d:%02d:%04.1f\n", int(localtime[0]), int(localtime[1]), localtime[2]+localtime[3]);
    std::printf("  UTCOffset: %2d hrs\n\n", int(observer->UTCOffset()));

    // Print some basic information regarding the planet itself
    std::printf("= PLANET =====================\n");
    std::printf("  Name  : %s\n", planet->Name().c_str());
    std::printf("  Mass  : %e kg\n", planet->Mass_kg());
    std::printf("  Radius: %f km\n", planet->Radius_m()/1000.0);
    std::printf("  Albedo: %f\n\n", planet->Albedo());
    
    std::vector<double> ra;
    std::vector<double> dec;
    
    // Now do the stuff we actually want
    std::printf("= NOTES ======================\n");
    std::printf("  * RA,DEC represent apparent ICRS coordinates for the observer\n");
    std::printf("  * Coordinates should be considered dubious at small altitudes\n");
    std::printf("\n");
    std::printf("      JD        LOCAL     RA (appar.)    DEC (appar.)     Az       Alt  \n") ;
    std::printf(" =======================================================================\n") ;
    int max_steps = int(duration/step_size);
    CESkyCoord obs_coords;
    CESkyCoord appar_coords;
    for (int s=0; s<=max_steps; s++) {

        // Get the observed coordinates
        obs_coords.SetCoordinates(obs.GetAzimuth_Rad(), obs.GetZenith_Rad(),
                                  CESkyCoordType::OBSERVED);
        // Convert to RA,DEC
        appar_coords = obs_coords.ConvertToICRS(*date, *observer);
        // Update the coordiantes of the planet
        ra  = appar_coords.XCoord().HmsVect();
        dec = appar_coords.YCoord().DmsVect();
        
        std::printf(" %11.2f  %08.1f  %2.0fh %2.0fm %4.1fs  %+3.0fd %2.0fm %4.1fs  %8.3f  %+7.3f\n",
                    double(*date), date->GetTime(observer->UTCOffset()),
                    ra[0], ra[1], ra[2] + ra[3],
                    dec[0], dec[1], dec[2] + dec[3],
                    obs_coords.XCoord().Deg(),
                    90.0-obs_coords.YCoord().Deg());
        
        // Update the date
        date->SetDate(date->JD() + step_size/(60.0*24.0), CEDateType::JD);
    }
    
    std::printf(" -------------------------------------------------------------------\n");
}